

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

QString * __thiscall QFontListView::text(QString *__return_storage_ptr__,QFontListView *this,int i)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  QStringListModel::stringList();
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&QStack_38.ptr[i].d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString text(int i) const {
        return model()->stringList().at(i);
    }